

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

void __thiscall Assimp::StreamReader<true,_true>::SetPtr(StreamReader<true,_true> *this,int8_t *p)

{
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  
  this->current = p;
  if ((p <= this->limit) && (this->buffer <= p)) {
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"End of file or read limit was reached",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SetPtr(int8_t* p)  {
        current = p;
        if (current > limit || current < buffer) {
            throw DeadlyImportError("End of file or read limit was reached");
        }
    }